

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O3

pboolean p_tree_rb_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                         PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                         pconstpointer key)

{
  ppointer pvVar1;
  bool bVar2;
  pint pVar3;
  PTreeRBNode *pPVar4;
  PTreeRBNode_ *pPVar5;
  PTreeRBNode *pPVar6;
  PTreeRBNode *node;
  
  pPVar6 = (PTreeRBNode *)*root_node;
  do {
    if (pPVar6 == (PTreeRBNode *)0x0) {
      return 0;
    }
    pVar3 = (*compare_func)(key,(pPVar6->base).key,data);
    if (-1 < pVar3) {
      if (pVar3 == 0) {
        pPVar4 = (PTreeRBNode *)(pPVar6->base).left;
        node = pPVar6;
        if (pPVar4 == (PTreeRBNode *)0x0) goto LAB_0010abd3;
        if ((pPVar6->base).right == (PTreeBaseNode_ *)0x0) goto LAB_0010abdc;
        do {
          node = pPVar4;
          pPVar4 = (PTreeRBNode *)(node->base).right;
        } while (pPVar4 != (PTreeRBNode *)0x0);
        pvVar1 = (node->base).value;
        (pPVar6->base).key = (node->base).key;
        (pPVar6->base).value = pvVar1;
        pPVar4 = (PTreeRBNode *)(node->base).left;
        if (pPVar4 == (PTreeRBNode *)0x0) {
LAB_0010abd3:
          pPVar4 = (PTreeRBNode *)(node->base).right;
          if (pPVar4 == (PTreeRBNode *)0x0) {
            bVar2 = true;
            if ((node->color & P_TREE_RB_COLOR_BLACK) != 0) {
              pp_tree_rb_balance_remove(node,root_node);
            }
            pPVar4 = (PTreeRBNode *)0x0;
          }
          else {
LAB_0010abdc:
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
        if (node == (PTreeRBNode *)*root_node) {
          pPVar5 = (PTreeRBNode_ *)0x0;
        }
        else {
          pPVar5 = node->parent;
          root_node = &(pPVar5->base).left + ((PTreeRBNode *)(pPVar5->base).left != node);
        }
        *root_node = &pPVar4->base;
        if ((!bVar2) && (pPVar4->parent = pPVar5, (node->color & P_TREE_RB_COLOR_BLACK) != 0)) {
          pPVar4->color = P_TREE_RB_COLOR_BLACK;
        }
        if (key_destroy_func != (PDestroyFunc)0x0) {
          (*key_destroy_func)((node->base).key);
        }
        if (value_destroy_func != (PDestroyFunc)0x0) {
          (*value_destroy_func)((node->base).value);
        }
        p_free(node);
        return 1;
      }
      pPVar6 = (PTreeRBNode *)&(pPVar6->base).right;
    }
    pPVar6 = (PTreeRBNode *)(pPVar6->base).left;
  } while( true );
}

Assistant:

pboolean
p_tree_rb_remove (PTreeBaseNode		**root_node,
		  PCompareDataFunc	compare_func,
		  ppointer		data,
		  PDestroyFunc		key_destroy_func,
		  PDestroyFunc		value_destroy_func,
		  pconstpointer		key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	*child_node;
	PTreeRBNode	*child_parent;
	pint		cmp_result;

	cur_node = *root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0)
			cur_node = cur_node->left;
		else if (cmp_result > 0)
			cur_node = cur_node->right;
		else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		prev_node = cur_node->left;

		while (prev_node->right != NULL)
			prev_node = prev_node->right;

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		/* Mark node for removal */
		cur_node = prev_node;
	}

	child_node = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (child_node == NULL && pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
		pp_tree_rb_balance_remove ((PTreeRBNode *) cur_node, root_node);

	/* Replace node with its child */
	if (cur_node == *root_node) {
		*root_node   = child_node;
		child_parent = NULL;
	} else {
		child_parent = ((PTreeRBNode *) cur_node)->parent;

		if (child_parent->base.left == cur_node)
			child_parent->base.left = child_node;
		else
			child_parent->base.right = child_node;
	}

	if (child_node != NULL) {
		((PTreeRBNode *) child_node)->parent = child_parent;

		/* Check if we need to repaint the node */
		if (pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
				((PTreeRBNode *) child_node)->color = P_TREE_RB_COLOR_BLACK;
	}

	/* Free unused node */
	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}